

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

void stbtt_Rasterize(stbtt__bitmap *result,float flatness_in_pixels,stbtt_vertex *vertices,
                    int num_verts,float scale_x,float scale_y,float shift_x,float shift_y,int x_off,
                    int y_off,int invert,void *userdata)

{
  undefined4 uVar1;
  stbtt__point sVar2;
  stbtt__point sVar3;
  undefined4 uVar4;
  undefined8 *puVar5;
  bool bVar6;
  uint uVar7;
  stbtt__active_edge *z;
  stbtt__point *__ptr;
  stbtt__point *points;
  stbtt__edge *p;
  float *scanline;
  stbtt__active_edge *psVar8;
  stbtt__active_edge *psVar9;
  undefined8 *puVar10;
  stbtt__active_edge *psVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uchar uVar18;
  int iVar19;
  stbtt__edge *psVar20;
  int iVar21;
  int iVar22;
  undefined4 in_register_00000084;
  stbtt__edge *psVar23;
  stbtt__active_edge *psVar24;
  long lVar25;
  bool bVar26;
  int iVar27;
  float *pfVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  undefined4 in_XMM3_Db;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float y0;
  stbtt__active_edge *active;
  float local_310;
  int local_2cc;
  float local_2b8;
  undefined1 local_298 [24];
  float *local_280;
  undefined8 *local_278;
  float local_26c;
  undefined1 local_268 [16];
  float *local_250;
  float local_248;
  ulong local_238;
  int local_230;
  
  local_298._8_8_ = CONCAT44(in_register_00000084,y_off);
  local_268._4_4_ = in_XMM3_Db;
  local_268._0_4_ = shift_x;
  local_268._8_4_ = in_XMM3_Dc;
  local_268._12_4_ = in_XMM3_Dd;
  if (0 < num_verts) {
    fVar29 = scale_y;
    if (scale_x <= scale_y) {
      fVar29 = scale_x;
    }
    fVar29 = (flatness_in_pixels / fVar29) * (flatness_in_pixels / fVar29);
    lVar15 = 0;
    uVar7 = 0;
    do {
      uVar7 = uVar7 + ((&vertices->type)[lVar15] == '\x01');
      lVar15 = lVar15 + 0xe;
    } while ((ulong)(uint)num_verts * 0xe != lVar15);
    if (uVar7 != 0) {
      uVar17 = (ulong)uVar7;
      local_248 = shift_y;
      __ptr = (stbtt__point *)malloc(uVar17 * 4);
      if (__ptr != (stbtt__point *)0x0) {
        scanline = (float *)&local_238;
        bVar12 = false;
        local_310 = 0.0;
        points = (stbtt__point *)0x0;
        fVar30 = 0.0;
        bVar6 = true;
        do {
          bVar26 = bVar6;
          if ((bVar12) &&
             (points = (stbtt__point *)malloc((long)(int)fVar30 << 3), points == (stbtt__point *)0x0
             )) goto LAB_00133bfe;
          local_238 = local_238 & 0xffffffff00000000;
          fVar30 = 0.0;
          fVar31 = 0.0;
          uVar7 = 0xffffffff;
          lVar15 = 0;
          do {
            fVar39 = (float)local_238;
            switch((&vertices->type)[lVar15]) {
            case '\x01':
              if (-1 < (int)uVar7) {
                (&__ptr->x)[uVar7] = (float)((int)(float)local_238 - (int)local_310);
              }
              uVar7 = uVar7 + 1;
              auVar33 = ZEXT416(*(uint *)((long)&vertices->x + lVar15));
              auVar33 = pshuflw(auVar33,auVar33,0x60);
              fVar30 = (float)(auVar33._0_4_ >> 0x10);
              fVar31 = (float)(auVar33._4_4_ >> 0x10);
              local_238 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
              if (points != (stbtt__point *)0x0) {
                points[(int)fVar39].x = fVar30;
                points[(int)fVar39].y = fVar31;
              }
              local_310 = fVar39;
              break;
            case '\x02':
              lVar25 = (long)(int)(float)local_238;
              auVar33 = ZEXT416(*(uint *)((long)&vertices->x + lVar15));
              auVar33 = pshuflw(auVar33,auVar33,0x60);
              fVar30 = (float)(auVar33._0_4_ >> 0x10);
              fVar31 = (float)(auVar33._4_4_ >> 0x10);
              local_238 = CONCAT44(local_238._4_4_,(int)(float)local_238 + 1);
              if (points != (stbtt__point *)0x0) {
                points[lVar25].x = fVar30;
                points[lVar25].y = fVar31;
              }
              break;
            case '\x03':
              stbtt__tesselate_curve
                        (points,(int *)scanline,fVar30,fVar31,
                         (float)(int)*(short *)((long)&vertices->cx + lVar15),
                         (float)(int)*(short *)((long)&vertices->cy + lVar15),
                         (float)(int)*(short *)((long)&vertices->x + lVar15),
                         (float)(int)*(short *)((long)&vertices->y + lVar15),fVar29,0);
              goto LAB_00132f6d;
            case '\x04':
              stbtt__tesselate_cubic
                        (points,(int *)scanline,fVar30,fVar31,
                         (float)(int)*(short *)((long)&vertices->cx + lVar15),
                         (float)(int)*(short *)((long)&vertices->cy + lVar15),
                         (float)(int)*(short *)((long)&vertices->cx1 + lVar15),
                         (float)(int)*(short *)((long)&vertices->cy1 + lVar15),
                         (float)(int)*(short *)((long)&vertices->x + lVar15),
                         (float)(int)*(short *)((long)&vertices->y + lVar15),fVar29,0);
LAB_00132f6d:
              auVar33 = ZEXT416(*(uint *)((long)&vertices->x + lVar15));
              auVar33 = pshuflw(auVar33,auVar33,0x60);
              fVar30 = (float)(auVar33._0_4_ >> 0x10);
              fVar31 = (float)(auVar33._4_4_ >> 0x10);
            }
            lVar15 = lVar15 + 0xe;
          } while ((ulong)(uint)num_verts * 0xe != lVar15);
          (&__ptr->x)[(int)uVar7] = (float)((int)(float)local_238 - (int)local_310);
          bVar12 = true;
          fVar30 = (float)local_238;
          bVar6 = false;
        } while (bVar26);
        if (points != (stbtt__point *)0x0) {
          uVar16 = 0;
          lVar15 = 0;
          do {
            lVar15 = (long)(int)lVar15 + (long)(int)(&__ptr->x)[uVar16];
            uVar16 = uVar16 + 1;
          } while (uVar17 != uVar16);
          local_2b8 = scale_y;
          if (invert != 0) {
            local_2b8 = -scale_y;
          }
          p = (stbtt__edge *)malloc(lVar15 * 0x14 + 0x14);
          if (p != (stbtt__edge *)0x0) {
            uVar16 = 0;
            uVar7 = 0;
            iVar22 = 0;
            do {
              fVar29 = (&__ptr->x)[uVar16];
              if (0 < (long)(int)fVar29) {
                lVar15 = 0;
                iVar19 = (int)fVar29 + -1;
                do {
                  lVar25 = (long)iVar19;
                  fVar30 = points[iVar22 + lVar25].y;
                  fVar31 = points[iVar22 + lVar15].y;
                  iVar21 = (int)lVar15;
                  if ((fVar30 != fVar31) || (NAN(fVar30) || NAN(fVar31))) {
                    psVar20 = p + (int)uVar7;
                    p[(int)uVar7].invert = 0;
                    iVar27 = iVar21;
                    if (invert == 0) {
                      if (fVar30 < fVar31) goto LAB_001330e5;
                    }
                    else if (fVar31 < fVar30) {
LAB_001330e5:
                      psVar20->invert = 1;
                      lVar25 = lVar15;
                      iVar27 = iVar19;
                    }
                    sVar2 = points[(long)iVar22 + (long)iVar27];
                    sVar3 = points[iVar22 + lVar25];
                    psVar20->x0 = sVar2.x * scale_x + (float)local_268._0_4_;
                    psVar20->y0 = sVar2.y * local_2b8 + local_248;
                    psVar20->x1 = sVar3.x * scale_x + (float)local_268._0_4_;
                    psVar20->y1 = sVar3.y * local_2b8 + local_248;
                    uVar7 = uVar7 + 1;
                  }
                  lVar15 = lVar15 + 1;
                  iVar19 = iVar21;
                } while ((int)fVar29 != lVar15);
              }
              iVar22 = (int)fVar29 + iVar22;
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar17);
            stbtt__sort_edges_quicksort(p,uVar7);
            if (1 < (int)uVar7) {
              uVar17 = 1;
              lVar15 = 2;
              psVar20 = p;
              do {
                uVar1 = p[uVar17].x0;
                uVar4 = p[uVar17].y0;
                local_230 = p[uVar17].invert;
                local_238._0_4_ = p[uVar17].x1;
                local_238._4_4_ = p[uVar17].y1;
                lVar25 = lVar15;
                psVar23 = psVar20;
                do {
                  if (psVar23->y0 <= (float)uVar4) {
                    uVar13 = (int)lVar25 - 1;
                    goto LAB_001331c4;
                  }
                  psVar23[1].invert = psVar23->invert;
                  fVar29 = psVar23->y0;
                  fVar30 = psVar23->x1;
                  fVar31 = psVar23->y1;
                  psVar23[1].x0 = psVar23->x0;
                  psVar23[1].y0 = fVar29;
                  psVar23[1].x1 = fVar30;
                  psVar23[1].y1 = fVar31;
                  lVar25 = lVar25 + -1;
                  psVar23 = psVar23 + -1;
                } while (1 < lVar25);
                uVar13 = 0;
LAB_001331c4:
                if (uVar17 != uVar13) {
                  p[(int)uVar13].x0 = (float)uVar1;
                  p[(int)uVar13].y0 = (float)uVar4;
                  p[(int)uVar13].x1 = (float)local_238;
                  p[(int)uVar13].y1 = (float)local_238._4_4_;
                  p[(int)uVar13].invert = local_230;
                }
                uVar17 = uVar17 + 1;
                lVar15 = lVar15 + 1;
                psVar20 = psVar20 + 1;
              } while (uVar17 != uVar7);
            }
            local_298._0_8_ = (stbtt__active_edge *)0x0;
            uVar17 = (ulong)result->w;
            if (0x40 < (long)uVar17) {
              scanline = (float *)malloc((ulong)(uint)result->w * 8 + 4);
            }
            iVar22 = result->h;
            p[(int)uVar7].y0 = (float)((int)local_298._8_8_ + iVar22) + 1.0;
            if (0 < iVar22) {
              local_26c = (float)x_off;
              local_280 = scanline + uVar17;
              local_250 = local_280 + 1;
              local_2cc = 0;
              local_278 = (undefined8 *)0x0;
              iVar22 = 0;
              psVar24 = (stbtt__active_edge *)0x0;
              uVar16 = local_298._8_8_;
              psVar20 = p;
              psVar11 = (stbtt__active_edge *)0x0;
              do {
                fVar29 = (float)(int)uVar16;
                fVar30 = fVar29 + 1.0;
                iVar19 = (int)uVar17;
                local_298._8_8_ = uVar16;
                local_298._16_8_ = psVar20;
                memset(scanline,0,(long)iVar19 * 4);
                pfVar28 = local_280;
                memset(local_280,0,(long)iVar19 * 4 + 4);
                psVar20 = (stbtt__edge *)local_298._16_8_;
                if (psVar11 != (stbtt__active_edge *)0x0) {
                  psVar8 = (stbtt__active_edge *)local_298;
                  do {
                    psVar9 = psVar11;
                    if (psVar11->ey <= fVar29) {
                      psVar8->next = psVar11->next;
                      if ((psVar11->direction == 0.0) && (!NAN(psVar11->direction))) {
                        __assert_fail("z->direction",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                      ,0xc4e,
                                      "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                     );
                      }
                      psVar11->direction = 0.0;
                      psVar11->next = psVar24;
                      psVar9 = psVar8;
                      psVar24 = psVar11;
                    }
                    psVar11 = psVar9->next;
                    psVar8 = psVar9;
                  } while (psVar11 != (stbtt__active_edge *)0x0);
                }
                fVar31 = *(float *)((long)psVar20 + 4);
                psVar11 = (stbtt__active_edge *)local_298._0_8_;
                puVar5 = local_278;
                while (local_298._0_8_ = psVar11, fVar31 <= fVar30) {
                  fVar39 = psVar20->y1;
                  puVar10 = puVar5;
                  if ((fVar31 != fVar39) || (psVar11 = psVar24, NAN(fVar31) || NAN(fVar39))) {
                    if (psVar24 == (stbtt__active_edge *)0x0) {
                      if (iVar22 == 0) {
                        puVar10 = (undefined8 *)malloc(0x6408);
                        if (puVar10 == (undefined8 *)0x0) {
                          __assert_fail("z != __null",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                        ,0xabe,
                                        "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                       );
                        }
                        *puVar10 = puVar5;
                        iVar22 = 799;
                      }
                      else {
                        iVar22 = iVar22 + -1;
                      }
                      psVar24 = (stbtt__active_edge *)(puVar10 + (long)iVar22 * 4 + 1);
                      psVar11 = (stbtt__active_edge *)0x0;
                    }
                    else {
                      psVar11 = psVar24->next;
                    }
                    fVar32 = psVar20->x0;
                    fVar34 = (psVar20->x1 - fVar32) / (fVar39 - fVar31);
                    psVar24->fdx = fVar34;
                    psVar24->fdy = (float)(-(uint)(fVar34 != 0.0) & (uint)(1.0 / fVar34));
                    psVar24->fx = ((fVar29 - fVar31) * fVar34 + fVar32) - local_26c;
                    psVar24->direction =
                         *(float *)(&DAT_00172f70 + (ulong)(psVar20->invert == 0) * 4);
                    psVar24->sy = fVar31;
                    psVar24->ey = fVar39;
                    psVar24->next = (stbtt__active_edge *)0x0;
                    if (fVar39 < fVar29) {
                      __assert_fail("z->ey >= scan_y_top",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                    ,0xc5b,
                                    "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                   );
                    }
                    psVar24->next = (stbtt__active_edge *)local_298._0_8_;
                    local_298._0_8_ = psVar24;
                  }
                  psVar23 = psVar20 + 1;
                  psVar20 = psVar20 + 1;
                  psVar24 = psVar11;
                  psVar11 = (stbtt__active_edge *)local_298._0_8_;
                  puVar5 = puVar10;
                  fVar31 = psVar23->y0;
                }
                local_278 = puVar5;
                if (psVar11 != (stbtt__active_edge *)0x0) {
                  local_298._16_8_ = psVar20;
                  fVar31 = (float)iVar19;
                  do {
                    fVar39 = psVar11->ey;
                    if (fVar39 < fVar29) {
                      __assert_fail("e->ey >= y_top",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                    ,0xb92,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    fVar32 = psVar11->fx;
                    fVar34 = psVar11->fdx;
                    if ((fVar34 != 0.0) || (NAN(fVar34))) {
                      fVar35 = psVar11->sy;
                      if (fVar30 < fVar35) {
                        __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                      ,0xba5,
                                      "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                     );
                      }
                      fVar41 = fVar34 + fVar32;
                      fVar36 = (float)(~-(uint)(fVar29 < fVar35) & (uint)fVar32 |
                                      (uint)((fVar35 - fVar29) * fVar34 + fVar32) &
                                      -(uint)(fVar29 < fVar35));
                      if ((((fVar36 < 0.0) ||
                           (fVar40 = (float)(~-(uint)(fVar39 < fVar30) & (uint)fVar41 |
                                            (uint)((fVar39 - fVar29) * fVar34 + fVar32) &
                                            -(uint)(fVar39 < fVar30)), fVar40 < 0.0)) ||
                          (fVar31 <= fVar36)) || (fVar31 <= fVar40)) {
                        if (0 < iVar19) {
                          local_268 = ZEXT416((uint)fVar32);
                          local_248 = fVar34;
                          iVar21 = 0;
                          do {
                            fVar34 = (float)iVar21;
                            iVar27 = iVar21 + 1;
                            fVar35 = (float)iVar27;
                            fVar39 = (fVar34 - fVar32) / local_248 + fVar29;
                            fVar36 = (fVar35 - fVar32) / local_248 + fVar29;
                            if ((fVar34 <= fVar32) || (fVar41 <= fVar35)) {
                              if ((fVar34 <= fVar41) || (fVar32 <= fVar35)) {
                                fVar40 = fVar29;
                                if (((fVar34 <= fVar32) || (fVar41 <= fVar34)) &&
                                   ((fVar34 <= fVar41 || (fVar32 <= fVar34)))) {
                                  fVar39 = fVar29;
                                  if (((fVar32 < fVar35) && (fVar35 < fVar41)) ||
                                     ((fVar34 = fVar32, fVar41 < fVar35 && (fVar35 < fVar32))))
                                  goto LAB_0013378a;
                                  goto LAB_00133846;
                                }
                              }
                              else {
                                stbtt__handle_clipped_edge
                                          (scanline,iVar21,psVar11,fVar32,fVar29,fVar35,fVar36);
                                fVar40 = fVar36;
                                fVar32 = fVar35;
                              }
                              stbtt__handle_clipped_edge
                                        (scanline,iVar21,psVar11,fVar32,fVar40,fVar34,fVar39);
                            }
                            else {
                              stbtt__handle_clipped_edge
                                        (scanline,iVar21,psVar11,fVar32,fVar29,fVar34,fVar39);
                              fVar32 = fVar34;
LAB_0013378a:
                              stbtt__handle_clipped_edge
                                        (scanline,iVar21,psVar11,fVar32,fVar39,fVar35,fVar36);
                              fVar39 = fVar36;
                              fVar34 = fVar35;
                            }
LAB_00133846:
                            stbtt__handle_clipped_edge
                                      (scanline,iVar21,psVar11,fVar34,fVar39,fVar41,fVar30);
                            fVar32 = (float)local_268._0_4_;
                            iVar21 = iVar27;
                          } while (iVar19 != iVar27);
                        }
                      }
                      else {
                        if (fVar35 <= fVar29) {
                          fVar35 = fVar29;
                        }
                        uVar7 = (uint)fVar36;
                        if (fVar30 <= fVar39) {
                          fVar39 = fVar30;
                        }
                        uVar13 = (uint)fVar40;
                        if (uVar7 == uVar13) {
                          if (((int)uVar7 < 0) || (iVar19 <= (int)uVar7)) {
                            __assert_fail("x >= 0 && x < len",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                          ,0xbc1,
                                          "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                         );
                          }
                          fVar32 = psVar11->direction;
                          uVar17 = (ulong)uVar7;
                          scanline[uVar17] =
                               (((fVar40 - (float)(int)uVar7) + (fVar36 - (float)(int)uVar7)) * -0.5
                               + 1.0) * fVar32 * (fVar39 - fVar35) + scanline[uVar17];
                          fVar32 = (fVar39 - fVar35) * fVar32;
                        }
                        else {
                          fVar34 = psVar11->fdy;
                          fVar38 = fVar40;
                          uVar14 = uVar7;
                          if (fVar40 < fVar36) {
                            fVar37 = fVar29 - fVar35;
                            fVar35 = (fVar29 - fVar39) + fVar30;
                            fVar34 = -fVar34;
                            fVar38 = fVar36;
                            fVar32 = fVar41;
                            uVar14 = uVar13;
                            uVar13 = uVar7;
                            fVar36 = fVar40;
                            fVar39 = fVar37 + fVar30;
                          }
                          iVar21 = uVar14 + 1;
                          fVar40 = ((float)iVar21 - fVar32) * fVar34 + fVar29;
                          fVar32 = psVar11->direction;
                          fVar41 = (fVar40 - fVar35) * fVar32;
                          lVar15 = (long)(int)uVar14;
                          scanline[lVar15] =
                               (((fVar36 - (float)(int)uVar14) + 1.0) * -0.5 + 1.0) * fVar41 +
                               scanline[lVar15];
                          if (uVar13 - iVar21 != 0 && iVar21 <= (int)uVar13) {
                            do {
                              scanline[lVar15 + 1] =
                                   fVar34 * fVar32 * 0.5 + fVar41 + scanline[lVar15 + 1];
                              fVar41 = fVar41 + fVar34 * fVar32;
                              lVar15 = lVar15 + 1;
                            } while (uVar13 - 1 != (int)lVar15);
                          }
                          if (1.01 < ABS(fVar41)) {
                            __assert_fail("fabs(area) <= 1.01f",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/stb/include/stb/stb_truetype.h"
                                          ,0xbe6,
                                          "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                         );
                          }
                          uVar17 = (ulong)(int)uVar13;
                          scanline[uVar17] =
                               (fVar39 - (fVar34 * (float)(int)(uVar13 - iVar21) + fVar40)) *
                               (((fVar38 - (float)(int)uVar13) + 0.0) * -0.5 + 1.0) * fVar32 +
                               fVar41 + scanline[uVar17];
                          fVar32 = (fVar39 - fVar35) * fVar32;
                        }
                        local_250[uVar17] = fVar32 + local_250[uVar17];
                      }
                    }
                    else if (fVar32 < fVar31) {
                      if (0.0 <= fVar32) {
                        local_268 = ZEXT416((uint)fVar32);
                        stbtt__handle_clipped_edge
                                  (scanline,(int)fVar32,psVar11,fVar32,fVar29,fVar32,fVar30);
                        iVar21 = (int)fVar32 + 1;
                        fVar32 = (float)local_268._0_4_;
                      }
                      else {
                        iVar21 = 0;
                      }
                      stbtt__handle_clipped_edge
                                (local_280,iVar21,psVar11,fVar32,fVar29,fVar32,fVar30);
                    }
                    psVar11 = psVar11->next;
                  } while (psVar11 != (stbtt__active_edge *)0x0);
                  uVar17 = (ulong)(uint)result->w;
                  psVar20 = (stbtt__edge *)local_298._16_8_;
                  pfVar28 = local_280;
                }
                psVar11 = (stbtt__active_edge *)local_298._0_8_;
                if (0 < (int)uVar17) {
                  fVar29 = 0.0;
                  lVar15 = 0;
                  do {
                    fVar29 = fVar29 + pfVar28[lVar15];
                    iVar19 = (int)(ABS(scanline[lVar15] + fVar29) * 255.0 + 0.5);
                    uVar18 = (uchar)iVar19;
                    if (0xfe < iVar19) {
                      uVar18 = 0xff;
                    }
                    result->pixels[lVar15 + (long)result->stride * (long)local_2cc] = uVar18;
                    lVar15 = lVar15 + 1;
                    uVar17 = (ulong)result->w;
                  } while (lVar15 < (long)uVar17);
                }
                for (; psVar11 != (stbtt__active_edge *)0x0; psVar11 = psVar11->next) {
                  psVar11->fx = psVar11->fdx + psVar11->fx;
                }
                uVar16 = (ulong)((int)local_298._8_8_ + 1);
                local_2cc = local_2cc + 1;
                psVar11 = (stbtt__active_edge *)local_298._0_8_;
                puVar5 = local_278;
              } while (local_2cc < result->h);
              while (puVar5 != (undefined8 *)0x0) {
                puVar10 = (undefined8 *)*puVar5;
                free(puVar5);
                puVar5 = puVar10;
              }
            }
            if (scanline != (float *)&local_238) {
              free(scanline);
            }
            free(p);
          }
          free(__ptr);
          __ptr = points;
LAB_00133bfe:
          free(__ptr);
        }
      }
    }
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_Rasterize(stbtt__bitmap *result, float flatness_in_pixels, stbtt_vertex *vertices, int num_verts, float scale_x, float scale_y, float shift_x, float shift_y, int x_off, int y_off, int invert, void *userdata)
{
   float scale            = scale_x > scale_y ? scale_y : scale_x;
   int winding_count      = 0;
   int *winding_lengths   = NULL;
   stbtt__point *windings = stbtt_FlattenCurves(vertices, num_verts, flatness_in_pixels / scale, &winding_lengths, &winding_count, userdata);
   if (windings) {
      stbtt__rasterize(result, windings, winding_lengths, winding_count, scale_x, scale_y, shift_x, shift_y, x_off, y_off, invert, userdata);
      STBTT_free(winding_lengths, userdata);
      STBTT_free(windings, userdata);
   }
}